

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CThumbInstruction.cpp
# Opt level: O2

void __thiscall CThumbInstruction::writeTempData(CThumbInstruction *this,TempData *tempData)

{
  int64_t memoryAddress;
  int iVar1;
  ulong uVar2;
  char str [256];
  allocator<char> local_139;
  string local_138;
  char local_118 [256];
  
  iVar1 = sprintf(local_118,"   %s",(this->Opcode).name);
  for (uVar2 = (ulong)iVar1; (long)uVar2 < 0xb; uVar2 = uVar2 + 1) {
    local_118[uVar2] = ' ';
  }
  local_118[uVar2 & 0xffffffff] = '\0';
  memoryAddress = this->RamPos;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,local_118,&local_139);
  TempData::writeLine(tempData,memoryAddress,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  return;
}

Assistant:

void CThumbInstruction::writeTempData(TempData& tempData) const
{
	char str[256];

	int pos = sprintf(str,"   %s",Opcode.name);
	while (pos < 11) str[pos++] = ' ';
	str[pos] = 0;
	FormatInstruction(Opcode.mask,&str[pos]);

	tempData.writeLine(RamPos,str);
}